

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

PipelineWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateComputePipeline
          (PipelineWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkComputePipelineCreateInfo *PipelineCI,VkPipelineCache cache,char *DebugName)

{
  VkResult errorCode;
  char local_71;
  char *DebugName_local;
  VkPipeline vkPipeline;
  __shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> local_48;
  char *local_38;
  
  DebugName_local = DebugName;
  if (PipelineCI->sType != VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[67]>
              ((string *)&vkPipeline,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO",
               (char (*) [67])cache);
    Diligent::DebugAssertionFailed
              ((Char *)vkPipeline,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x10d);
    std::__cxx11::string::~string((string *)&vkPipeline);
  }
  if (DebugName == (char *)0x0) {
    DebugName = "";
    DebugName_local = "";
  }
  vkPipeline = (VkPipeline)0x0;
  errorCode = (*vkCreateComputePipelines)
                        (this->m_VkDevice,cache,1,PipelineCI,this->m_VkAllocator,&vkPipeline);
  if (errorCode != VK_SUCCESS) {
    local_71 = '\'';
    local_38 = VkResultToString(errorCode);
    Diligent::LogError<true,char[36],char_const*,char,char[17],char_const*>
              (false,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x115,(char (*) [36])"Failed to create compute pipeline \'",&DebugName_local,
               &local_71,(char (*) [17])"\nVK Error Code: ",&local_38);
    DebugName = DebugName_local;
  }
  if (*DebugName != '\0') {
    SetPipelineName(this->m_VkDevice,vkPipeline,DebugName);
  }
  std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
            ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2> *)
             &local_48,
             (__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                *)__return_storage_ptr__,&local_48);
  __return_storage_ptr__->m_VkObject = vkPipeline;
  vkPipeline = (VkPipeline)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

PipelineWrapper VulkanLogicalDevice::CreateComputePipeline(const VkComputePipelineCreateInfo& PipelineCI,
                                                           VkPipelineCache                    cache,
                                                           const char*                        DebugName) const
{
    VERIFY_EXPR(PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO);

    if (DebugName == nullptr)
        DebugName = "";

    VkPipeline vkPipeline = VK_NULL_HANDLE;

    VkResult err = vkCreateComputePipelines(m_VkDevice, cache, 1, &PipelineCI, m_VkAllocator, &vkPipeline);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create compute pipeline '", DebugName, '\'');

    if (*DebugName != 0)
        SetPipelineName(m_VkDevice, vkPipeline, DebugName);

    return PipelineWrapper{GetSharedPtr(), std::move(vkPipeline)};
}